

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O1

bool __thiscall
RoboClaw::SetM1PositionPID
          (RoboClaw *this,float kp_fp,float ki_fp,float kd_fp,uint32_t kiMax,uint32_t deadzone,
          uint32_t min,uint32_t max)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = vcvttss2usi_avx512f(ZEXT416((uint)(kp_fp * 1024.0)));
  uVar4 = vcvttss2usi_avx512f(ZEXT416((uint)(ki_fp * 1024.0)));
  uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(kd_fp * 1024.0)));
  bVar1 = write_n(this,'\x1e',(ulong)this->m_address,0x3d,(ulong)(uVar2 >> 0x18),
                  (ulong)(uVar2 >> 0x10 & 0xff),(ulong)(uVar2 >> 8 & 0xff),(ulong)(uVar2 & 0xff),
                  (ulong)(uVar3 >> 0x18),(ulong)(uVar3 >> 0x10 & 0xff),(ulong)(uVar3 >> 8 & 0xff),
                  (ulong)(uVar3 & 0xff),(ulong)(uVar4 >> 0x18),(ulong)(uVar4 >> 0x10 & 0xff),
                  (ulong)(uVar4 >> 8 & 0xff),(ulong)(uVar4 & 0xff),kiMax >> 0x18,
                  (ulong)(kiMax >> 0x10 & 0xff),(ulong)(kiMax >> 8 & 0xff),(ulong)(kiMax & 0xff),
                  (ulong)(deadzone >> 0x18),(ulong)(deadzone >> 0x10 & 0xff),
                  (ulong)(deadzone >> 8 & 0xff),(ulong)(deadzone & 0xff),(ulong)(min >> 0x18),
                  (ulong)(min >> 0x10 & 0xff),(ulong)(min >> 8 & 0xff),(ulong)(min & 0xff),
                  (ulong)(max >> 0x18),(ulong)(max >> 0x10 & 0xff),(ulong)(max >> 8 & 0xff),
                  (ulong)(max & 0xff));
  return bVar1;
}

Assistant:

bool RoboClaw::SetM1PositionPID( float kp_fp,float ki_fp,float kd_fp,uint32_t kiMax,uint32_t deadzone,uint32_t min,uint32_t max)
{			
    uint32_t kp=kp_fp*1024;
    uint32_t ki=ki_fp*1024;
    uint32_t kd=kd_fp*1024;
    return write_n(30, m_address, SETM1POSPID,SetDWORDval(kd),SetDWORDval(kp),SetDWORDval(ki),SetDWORDval(kiMax),SetDWORDval(deadzone),SetDWORDval(min),SetDWORDval(max));
}